

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkpar.c
# Opt level: O0

action * get_shifts(int stateno)

{
  int iVar1;
  int iVar2;
  shifts *psVar3;
  action *paVar4;
  int symbol;
  int k;
  int i;
  Yshort *to_state;
  shifts *sp;
  action *temp;
  action *actions;
  int stateno_local;
  
  temp = (action *)0x0;
  psVar3 = shift_table[stateno];
  if (psVar3 != (shifts *)0x0) {
    symbol = psVar3->nshifts;
    while (symbol = symbol + -1, -1 < symbol) {
      iVar1 = psVar3->shift[symbol];
      iVar2 = accessing_symbol[iVar1];
      if (iVar2 < start_symbol) {
        paVar4 = (action *)allocate(0x18);
        paVar4->next = temp;
        paVar4->symbol = iVar2;
        paVar4->number = iVar1;
        paVar4->prec = symbol_prec[iVar2];
        paVar4->action_code = '\x01';
        paVar4->assoc = symbol_assoc[iVar2];
        temp = paVar4;
      }
    }
  }
  return temp;
}

Assistant:

action *get_shifts(int stateno)
{
    register action *actions, *temp;
    register shifts *sp;
    register Yshort *to_state;
    register int i, k;
    register int symbol;

    actions = 0;
    sp = shift_table[stateno];
    if (sp)
    {
	to_state = sp->shift;
	for (i = sp->nshifts - 1; i >= 0; i--)
	{
	    k = to_state[i];
	    symbol = accessing_symbol[k];
	    if (ISTOKEN(symbol))
	    {
		temp = NEW(action);
		temp->next = actions;
		temp->symbol = symbol;
		temp->number = k;
		temp->prec = symbol_prec[symbol];
		temp->action_code = SHIFT;
		temp->assoc = symbol_assoc[symbol];
		actions = temp;
	    }
	}
    }
    return (actions);
}